

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrtInfo.cpp
# Opt level: O0

void pbrt::semantic::pbrtInfo(int ac,char **av)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  char *pcVar4;
  runtime_error *prVar5;
  ostream *poVar6;
  long in_RSI;
  int in_EDI;
  runtime_error e;
  PBRTInfo info;
  shared_ptr<pbrt::Scene> scene;
  string arg;
  int i;
  bool parseOnly;
  string fileName;
  shared_ptr<pbrt::Scene> *in_stack_fffffffffffffc68;
  PBRTInfo *in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  string *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  char *in_stack_fffffffffffffcb8;
  allocator *paVar7;
  Scene *this;
  string *in_stack_fffffffffffffe98;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [55];
  undefined1 local_e9 [56];
  undefined1 local_b1;
  string local_90 [55];
  allocator local_59;
  string local_58 [8];
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  int local_38;
  string local_30 [32];
  long local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  std::__cxx11::string::string(local_30);
  bVar1 = false;
  local_38 = 1;
  do {
    if (local_4 <= local_38) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"pbrtinfo - printing info on pbrt file ...");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::shared_ptr<pbrt::Scene>::shared_ptr((shared_ptr<pbrt::Scene> *)0x10d118);
      this = (Scene *)local_e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_e9 + 1),".pbrt",(allocator *)this);
      bVar2 = endsWith((string *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8);
      std::__cxx11::string::~string((string *)(local_e9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_e9);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_120,"",&local_121);
        importPBRT(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        std::shared_ptr<pbrt::Scene>::operator=
                  ((shared_ptr<pbrt::Scene> *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x10d1f5);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
      }
      else {
        paVar7 = &local_149;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_148,".pbf",paVar7);
        bVar3 = endsWith((string *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                         in_stack_fffffffffffffca8);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
        if ((bVar3 & 1) == 0) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"un-recognized input file extension");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        Scene::loadFrom(in_stack_fffffffffffffe98);
        std::shared_ptr<pbrt::Scene>::operator=
                  ((shared_ptr<pbrt::Scene> *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x10d367);
      }
      std::__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x10d440);
      Scene::makeSingleLevel(this);
      poVar6 = std::operator<<((ostream *)&std::cout," => yay! parsing successful...");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      if (bVar1) {
        exit(0);
      }
      std::shared_ptr<pbrt::Scene>::shared_ptr
                ((shared_ptr<pbrt::Scene> *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      PBRTInfo::PBRTInfo((PBRTInfo *)info.numObjects.instanced,(SP *)info.numObjects.unique);
      std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x10d4c3);
      PBRTInfo::~PBRTInfo(in_stack_fffffffffffffc70);
      std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x10d60a);
      std::__cxx11::string::~string(local_30);
      return;
    }
    pcVar4 = *(char **)(local_10 + (long)local_38 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,pcVar4,&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    if (bVar2) {
LAB_0010cebb:
      bVar1 = true;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
      if (bVar2) goto LAB_0010cebb;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
      if (*pcVar4 == '-') {
        local_b1 = 1;
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(in_stack_fffffffffffffcb8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
        std::runtime_error::runtime_error(prVar5,local_90);
        local_b1 = 0;
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=(local_30,local_58);
    }
    std::__cxx11::string::~string(local_58);
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void pbrtInfo(int ac, char **av)
    {
      std::string fileName;
      bool parseOnly = false;
      for (int i=1;i<ac;i++) {
        const std::string arg = av[i];
        if (arg == "--lint" || arg == "-lint") {
          parseOnly = true;
        } else if (arg[0] == '-') {
          throw std::runtime_error("invalid argument '"+arg+"'");
        } else {
          fileName = arg;
        }          
      }
    
      std::cout << "-------------------------------------------------------" << std::endl;
      std::cout << "pbrtinfo - printing info on pbrt file ..." << std::endl;
      std::cout << "-------------------------------------------------------" << std::endl;
    
      std::shared_ptr<Scene> scene;
      try {
        if (endsWith(fileName,".pbrt"))
          scene = importPBRT(fileName);
        else if (endsWith(fileName,".pbf"))
          scene = Scene::loadFrom(fileName);
        else
          throw std::runtime_error("un-recognized input file extension");

        scene->makeSingleLevel();
        
        std::cout << " => yay! parsing successful..." << std::endl;
        if (parseOnly) exit(0);
        PBRTInfo info(scene);
      } catch (std::runtime_error e) {
        std::cerr << "**** ERROR IN PARSING ****" << std::endl << e.what() << std::endl;
        std::cerr << "(this means that either there's something wrong with that PBRT file, or that the parser can't handle it)" << std::endl;
        exit(1);
      }
    }